

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preBegin__profile_GLSL__technique__pass__material_specular
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar1;
  profile_GLSL__technique__pass__material_specular__AttributeData *ppVar2;
  undefined *puVar3;
  xmlChar **ppxVar4;
  
  ppVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::profile_GLSL__technique__pass__material_specular__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar4 = attributes->attributes;
  if (ppxVar4 != (xmlChar **)0x0) {
    for (; text = *ppxVar4, text != (ParserChar *)0x0; ppxVar4 = ppxVar4 + 2) {
      puVar3 = (undefined *)GeneratedSaxParser::Utils::calculateStringHash(text);
      additionalText = ppxVar4[1];
      if (puVar3 == (undefined *)0x76887d) {
        ppVar2->param = additionalText;
      }
      else {
        if (puVar3 == &DAT_007c83b5) {
          bVar1 = GeneratedSaxParser::
                  ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                  ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                            (&this->
                              super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                             ,additionalText,&ppVar2->value);
          if (bVar1) {
            *(byte *)&ppVar2->present_attributes = (byte)ppVar2->present_attributes | 1;
            goto LAB_006e7559;
          }
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0xe3f2ee2,0x7c83b5,additionalText);
        }
        else {
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0xe3f2ee2,text,additionalText);
        }
        if (bVar1 != false) {
          return false;
        }
      }
LAB_006e7559:
    }
  }
  if (((ppVar2->present_attributes & 1) == 0) &&
     (bVar1 = GeneratedSaxParser::
              ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
              ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                        (&this->
                          super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                         ,"0.0E1 0.0E1 0.0E1 1.0E0",&ppVar2->value), bVar1)) {
    *(byte *)&ppVar2->present_attributes = (byte)ppVar2->present_attributes | 1;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass__material_specular( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLSL__technique__pass__material_specular( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLSL__technique__pass__material_specular__AttributeData* attributeData = newData<profile_GLSL__technique__pass__material_specular__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2FloatList(attributeValue, attributeData->value, 0, HASH_ELEMENT_MATERIAL_SPECULAR, HASH_ATTRIBUTE_value);
    }
    else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATERIAL_SPECULAR,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__float4(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_MATERIAL_SPECULAR,
            HASH_ATTRIBUTE_value,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLSL__technique__pass__material_specular__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_MATERIAL_SPECULAR,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_MATERIAL_SPECULAR, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLSL__technique__pass__material_specular__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    bool failed;
    failed = !characterData2FloatList("0.0E1 0.0E1 0.0E1 1.0E0", attributeData->value);
    if ( !failed )
    attributeData->present_attributes |= profile_GLSL__technique__pass__material_specular__AttributeData::ATTRIBUTE_VALUE_PRESENT;
}


    return true;
}